

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::ValidationContextImpl::isPrefixUnknown(ValidationContextImpl *this,XMLCh *prefix)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  bool local_21;
  XMLCh *pXStack_20;
  bool unknown;
  XMLCh *prefix_local;
  ValidationContextImpl *this_local;
  
  local_21 = false;
  pXStack_20 = prefix;
  prefix_local = (XMLCh *)this;
  bVar1 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgXMLNSString);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = XMLString::equals(pXStack_20,L"xml");
    if (!bVar1) {
      if ((this->fElemStack == (ElemStack *)0x0) ||
         (bVar1 = ElemStack::isEmpty(this->fElemStack), bVar1)) {
        if (this->fNamespaceScope != (NamespaceScope *)0x0) {
          uVar2 = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                     _vptr_XercesNamespaceResolver)(this->fNamespaceScope,pXStack_20);
          uVar3 = NamespaceScope::getEmptyNamespaceId(this->fNamespaceScope);
          local_21 = uVar2 == uVar3;
        }
      }
      else {
        ElemStack::mapPrefixToURI(this->fElemStack,pXStack_20,&local_21);
      }
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationContextImpl::isPrefixUnknown(XMLCh* prefix) {
    bool unknown = false;
    if (XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
        return true;
    }
    else if (!XMLString::equals(prefix, XMLUni::fgXMLString)) {
        if(fElemStack && !fElemStack->isEmpty())
            fElemStack->mapPrefixToURI(prefix, unknown);
        else if(fNamespaceScope)
            unknown = (fNamespaceScope->getNamespaceForPrefix(prefix)==fNamespaceScope->getEmptyNamespaceId());
    }
    return unknown;
}